

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

VarPackedStruct * __thiscall
kratos::Generator::var_packed
          (Generator *this,string *var_name,shared_ptr<kratos::PackedStruct> *packed_struct_,
          uint32_t size)

{
  VarPackedStruct *pVVar1;
  initializer_list<unsigned_int> __l;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  uint32_t local_30;
  allocator_type local_29;
  
  __l._M_len = 1;
  __l._M_array = &local_30;
  local_30 = size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48,__l,&local_29);
  pVVar1 = var_packed(this,var_name,packed_struct_,
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_48);
  return pVVar1;
}

Assistant:

VarPackedStruct &Generator::var_packed(const std::string &var_name,
                                       const std::shared_ptr<PackedStruct> &packed_struct_,
                                       uint32_t size) {
    return var_packed(var_name, packed_struct_, std::vector<uint32_t>{size});
}